

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
CanStorePropertyValueDirectly
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,bool allowLetConst)

{
  code *pcVar1;
  bool bVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 *puVar3;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  ScriptContext *scriptContext;
  bool allowLetConst_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  scriptContext._3_1_ = allowLetConst;
  scriptContext._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)
               RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  if (scriptContext._4_4_ == -1) {
    this_local._7_1_ = true;
  }
  else {
    local_40 = ScriptContext::GetPropertyName((ScriptContext *)descriptor,scriptContext._4_4_);
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->propertyMap);
    bVar2 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                        *)this_00,&local_40,
                       (SimpleDictionaryPropertyDescriptor<int> **)&propertyRecord);
    if (bVar2) {
      if (((scriptContext._3_1_ & 1) == 0) ||
         (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 0x1000) == 0)) {
        if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject & 0x1000) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0xbd2,"(!(descriptor->Attributes & 0x10))",
                                      "Asking about a global property this type handler doesn\'t have?"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        bVar2 = SimpleDictionaryPropertyDescriptor<int>::IsOrMayBecomeFixed
                          ((SimpleDictionaryPropertyDescriptor<int> *)propertyRecord);
        this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xbd8,"(false)",
                                  "Asking about a property this type handler doesn\'t know about?");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::CanStorePropertyValueDirectly(const DynamicObject* instance, PropertyId propertyId, bool allowLetConst)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;

        // We pass Constants::NoProperty for ActivationObjects for functions with same named formals.
        if (propertyId == Constants::NoProperty)
        {
            return true;
        }

        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (allowLetConst && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return true;
            }
            else
            {
                AssertMsg(!(descriptor->Attributes & PropertyLetConstGlobal), "Asking about a global property this type handler doesn't have?");
                return !descriptor->IsOrMayBecomeFixed();
            }
        }
        else
        {
            AssertMsg(false, "Asking about a property this type handler doesn't know about?");
            return false;
        }
    }